

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

uchar * nvpair_pack_string_array(nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  char **ppcVar1;
  size_t sVar2;
  ulong __n;
  char **array;
  size_t len;
  size_t size;
  uint ii;
  size_t *leftp_local;
  uchar *ptr_local;
  nvpair_t *nvp_local;
  
  if (nvp == (nvpair_t *)0x0) {
    __assert_fail("(nvp) != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x220,
                  "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
                 );
  }
  if (nvp->nvp_magic != 0x6e7670) {
    __assert_fail("(nvp)->nvp_magic == 0x6e7670",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x220,
                  "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
                 );
  }
  if (nvp->nvp_type != 10) {
    __assert_fail("nvp->nvp_type == 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x221,
                  "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
                 );
  }
  if (nvp->nvp_datasize <= *leftp) {
    len = 0;
    ppcVar1 = nvpair_get_string_array(nvp,(size_t *)0x0);
    if (ppcVar1 == (char **)0x0) {
      __assert_fail("array != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                    ,0x226,
                    "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
                   );
    }
    size._4_4_ = 0;
    leftp_local = (size_t *)ptr;
    while( true ) {
      if (nvp->nvp_nitems <= (ulong)size._4_4_) {
        if (len == nvp->nvp_datasize) {
          return (uchar *)leftp_local;
        }
        __assert_fail("size == nvp->nvp_datasize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                      ,0x232,
                      "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
                     );
      }
      sVar2 = strlen(ppcVar1[size._4_4_]);
      __n = sVar2 + 1;
      if (*leftp < __n) break;
      memcpy(leftp_local,ppcVar1[size._4_4_],__n);
      len = __n + len;
      leftp_local = (size_t *)(__n + (long)leftp_local);
      *leftp = *leftp - __n;
      size._4_4_ = size._4_4_ + 1;
    }
    __assert_fail("*leftp >= len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x22a,
                  "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
                 );
  }
  __assert_fail("*leftp >= nvp->nvp_datasize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x222,
                "unsigned char *nvpair_pack_string_array(const nvpair_t *, unsigned char *, size_t *)"
               );
}

Assistant:

unsigned char *
nvpair_pack_string_array(const nvpair_t *nvp, unsigned char *ptr, size_t *leftp)
{
	unsigned int ii;
	size_t size, len;
	const char * const *array;

	NVPAIR_ASSERT(nvp);
	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_STRING_ARRAY);
	PJDLOG_ASSERT(*leftp >= nvp->nvp_datasize);

	size = 0;
	array = nvpair_get_string_array(nvp, NULL);
	PJDLOG_ASSERT(array != NULL);

	for (ii = 0; ii < nvp->nvp_nitems; ii++) {
		len = strlen(array[ii]) + 1;
		PJDLOG_ASSERT(*leftp >= len);

		memcpy(ptr, (const void *)array[ii], len);
		size += len;
		ptr += len;
		*leftp -= len;
	}

	PJDLOG_ASSERT(size == nvp->nvp_datasize);

	return (ptr);
}